

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrent_echo_server.cpp
# Opt level: O2

void __thiscall fd_dispatcher::fd_dispatcher(fd_dispatcher *this,int port,size_t thread_cnt)

{
  pointer this_00;
  anon_class_1_0_00000001 local_e9;
  vector<worker,_std::allocator<worker>_> *local_e8;
  tcp_acceptor *local_e0;
  vector<worker,_std::allocator<worker>_> workers;
  pair<ranger::event::tcp_connection,_ranger::event::tcp_connection> conn_pair;
  
  ranger::event::dispatcher::dispatcher(&this->m_disp);
  ranger::event::endpoint::endpoint((endpoint *)&conn_pair,port);
  ranger::event::tcp_acceptor::tcp_acceptor(&this->m_acc,&this->m_disp,(endpoint *)&conn_pair,-1);
  local_e8 = &this->m_workers;
  (this->m_workers).super__Vector_base<worker,_std::allocator<worker>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_worker_idx = 0;
  (this->m_workers).super__Vector_base<worker,_std::allocator<worker>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_workers).super__Vector_base<worker,_std::allocator<worker>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e0 = &this->m_acc;
  conn_pair.first.m_top_bev = (bufferevent *)this;
  std::function<bool(ranger::event::tcp_acceptor&,int)>::operator=
            ((function<bool(ranger::event::tcp_acceptor&,int)> *)&(this->m_acc).m_event_handler,
             (anon_class_8_1_8991fb9c *)&conn_pair);
  std::vector<worker,_std::allocator<worker>_>::vector
            (&workers,thread_cnt,(allocator_type *)&conn_pair);
  for (this_00 = workers.super__Vector_base<worker,_std::allocator<worker>_>._M_impl.
                 super__Vector_impl_data._M_start;
      this_00 !=
      workers.super__Vector_base<worker,_std::allocator<worker>_>._M_impl.super__Vector_impl_data.
      _M_finish; this_00 = this_00 + 1) {
    ranger::event::tcp_connection::create_pair((dispatcher *)&conn_pair,&this->m_disp);
    std::function<void(ranger::event::tcp_connection&,ranger::event::tcp_connection::event_code)>::
    operator=((function<void(ranger::event::tcp_connection&,ranger::event::tcp_connection::event_code)>
               *)&conn_pair.first.m_event_handler,&local_e9);
    ranger::event::tcp_connection::operator=(&this_00->m_external_conn,&conn_pair.first);
    worker::set_internal_connection(this_00,&conn_pair.second);
    std::pair<ranger::event::tcp_connection,_ranger::event::tcp_connection>::~pair(&conn_pair);
  }
  std::vector<worker,_std::allocator<worker>_>::_M_move_assign(local_e8,&workers);
  std::vector<worker,_std::allocator<worker>_>::~vector(&workers);
  return;
}

Assistant:

fd_dispatcher(int port, size_t thread_cnt)
		: m_acc(m_disp, ranger::event::endpoint(port)) {
		m_acc.set_event_handler([this] (ranger::event::tcp_acceptor& acc, int fd) {
			return m_workers[m_worker_idx++ % m_workers.size()].take_fd(fd);
		});

		decltype(m_workers) workers(thread_cnt);
		for (auto i = workers.begin(); i != workers.end(); ++i) {
			auto conn_pair = ranger::event::tcp_connection::create_pair(m_disp, i->event_dispatcher());
			conn_pair.first.set_event_handler([] (ranger::event::tcp_connection& conn, ranger::event::tcp_connection::event_code what) {
				switch (what) {
				case ranger::event::tcp_connection::event_code::timeout:
				case ranger::event::tcp_connection::event_code::error:
				case ranger::event::tcp_connection::event_code::eof:
					conn.close();
					break;
				default:
					break;
				}
			});

			i->set_external_connection(std::move(conn_pair.first));
			i->set_internal_connection(std::move(conn_pair.second));
		}

		m_workers = std::move(workers);
	}